

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O1

void Fra_AddClausesMux(Fra_Man_t *p,Aig_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  Fra_Man_t *pFVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  uint uVar9;
  int pLits [4];
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  uint local_88;
  uint local_84;
  uint local_80;
  lit local_7c [3];
  ulong local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  Fra_Man_t *local_48;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x33,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  local_48 = p;
  iVar5 = Aig_ObjIsMuxType(pNode);
  if (iVar5 == 0) {
    __assert_fail("Aig_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x34,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  pAVar7 = Aig_ObjRecognizeMux(pNode,&local_38,&local_40);
  pFVar4 = local_48;
  uVar1 = *(uint *)(*(long *)((long)(pAVar7->field_5).pData + 0x98) + (long)pAVar7->Id * 4);
  local_70 = (ulong)uVar1;
  uVar2 = *(uint *)(*(long *)(*(long *)(((ulong)local_38 & 0xfffffffffffffffe) + 0x28) + 0x98) +
                   (long)*(int *)(((ulong)local_38 & 0xfffffffffffffffe) + 0x24) * 4);
  local_50 = (ulong)*(uint *)(*(long *)(*(long *)(((ulong)local_40 & 0xfffffffffffffffe) + 0x28) +
                                       0x98) +
                             (long)*(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 0x24) * 4);
  uVar9 = (uint)local_38 & 1;
  uVar8 = uVar1 * 2 + 1;
  local_84 = uVar9 + uVar2 * 2 ^ 1;
  uVar1 = *(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) * 2;
  local_88 = uVar8;
  local_80 = uVar1;
  local_5c = local_84;
  iVar5 = sat_solver_addclause(local_48->pSat,(lit *)&local_88,local_7c);
  if (iVar5 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0x4c,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
  }
  local_84 = uVar2 * 2 | uVar9;
  uVar9 = uVar1 | 1;
  local_88 = uVar8;
  local_80 = uVar9;
  local_60 = local_84;
  local_58 = (ulong)uVar2;
  iVar5 = sat_solver_addclause(pFVar4->pSat,(lit *)&local_88,local_7c);
  if (iVar5 != 0) {
    uVar8 = (uint)local_40 & 1;
    uVar2 = (int)local_70 * 2;
    iVar5 = (int)local_50;
    local_84 = uVar8 + iVar5 * 2 ^ 1;
    local_70 = CONCAT44(local_70._4_4_,uVar1);
    local_88 = uVar2;
    local_80 = uVar1;
    local_64 = local_84;
    iVar6 = sat_solver_addclause(pFVar4->pSat,(lit *)&local_88,local_7c);
    if (iVar6 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                    ,0x56,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
    }
    uVar8 = iVar5 * 2 | uVar8;
    local_88 = uVar2;
    local_84 = uVar8;
    local_80 = uVar9;
    iVar6 = sat_solver_addclause(pFVar4->pSat,(lit *)&local_88,local_7c);
    if (iVar6 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                    ,0x5b,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
    }
    uVar3 = (undefined4)local_70;
    if ((int)local_58 != iVar5) {
      local_88 = local_60;
      local_84 = uVar8;
      local_80 = uVar9;
      iVar5 = sat_solver_addclause(pFVar4->pSat,(lit *)&local_88,local_7c);
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                      ,0x6e,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
      }
      local_88 = local_5c;
      local_84 = local_64;
      local_80 = uVar3;
      iVar5 = sat_solver_addclause(pFVar4->pSat,(lit *)&local_88,local_7c);
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                      ,0x73,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
      }
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                ,0x51,"void Fra_AddClausesMux(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Addes clauses to the solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_AddClausesMux( Fra_Man_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Fra_ObjSatNum(pNode);
    VarI = Fra_ObjSatNum(pNodeI);
    VarT = Fra_ObjSatNum(Aig_Regular(pNodeT));
    VarE = Fra_ObjSatNum(Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}